

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.c
# Opt level: O0

int wally_scriptsig_p2pkh_from_sig
              (uchar *pub_key,size_t pub_key_len,uchar *sig,size_t sig_len,uint32_t sighash,
              uchar *bytes_out,size_t len,size_t *written)

{
  size_t sig_len_00;
  int local_a4;
  size_t sStack_a0;
  int ret;
  size_t der_len;
  uchar buff [73];
  uchar *bytes_out_local;
  uint32_t sighash_local;
  size_t sig_len_local;
  uchar *sig_local;
  size_t pub_key_len_local;
  uchar *pub_key_local;
  
  if (written != (size_t *)0x0) {
    *written = 0;
  }
  if ((sighash & 0xffffff00) == 0) {
    local_a4 = wally_ec_sig_to_der(sig,sig_len,(uchar *)&der_len,0x49,&stack0xffffffffffffff60);
    if (local_a4 == 0) {
      sig_len_00 = sStack_a0 + 1;
      buff[sStack_a0 - 8] = (uchar)sighash;
      sStack_a0 = sig_len_00;
      local_a4 = wally_scriptsig_p2pkh_from_der
                           (pub_key,pub_key_len,(uchar *)&der_len,sig_len_00,bytes_out,len,written);
      wally_clear(&der_len,sStack_a0);
    }
    pub_key_local._4_4_ = local_a4;
  }
  else {
    pub_key_local._4_4_ = -2;
  }
  return pub_key_local._4_4_;
}

Assistant:

int wally_scriptsig_p2pkh_from_sig(const unsigned char *pub_key, size_t pub_key_len,
                                   const unsigned char *sig, size_t sig_len,
                                   uint32_t sighash,
                                   unsigned char *bytes_out, size_t len, size_t *written)
{
    unsigned char buff[EC_SIGNATURE_DER_MAX_LEN + 1];
    size_t der_len;
    int ret;

    if (written)
        *written = 0;
    if (sighash & 0xffffff00)
        return WALLY_EINVAL;

    ret = wally_ec_sig_to_der(sig, sig_len, buff, sizeof(buff), &der_len);
    if (ret == WALLY_OK) {
        buff[der_len++] = sighash & 0xff;
        ret = wally_scriptsig_p2pkh_from_der(pub_key, pub_key_len,
                                             buff, der_len,
                                             bytes_out, len, written);
        wally_clear(buff, der_len);
    }
    return ret;
}